

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

void __thiscall
CVmObjIntClsMod::build_prop_list(CVmObjIntClsMod *this,vm_obj_id_t self,vm_val_t *retval)

{
  CVmObjPageEntry *pCVar1;
  uint uVar2;
  char *pcVar3;
  undefined4 uVar4;
  vm_obj_id_t vVar5;
  undefined4 uVar6;
  vm_datatype_t *pvVar7;
  vm_val_t *pvVar8;
  int iVar9;
  long lVar10;
  undefined4 extraout_var;
  vm_val_t base_val;
  undefined1 local_40 [16];
  
  pvVar8 = sp_;
  pvVar7 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar7 = VM_OBJ;
  (pvVar8->val).obj = self;
  CVmObjTads::build_prop_list(&this->super_CVmObjTads,self,retval);
  pcVar3 = (this->super_CVmObjTads).super_CVmObject.ext_;
  if (*(short *)(pcVar3 + 0x24) != 0) {
    uVar2 = *(uint *)(pcVar3 + 0x28);
    pCVar1 = G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff);
    lVar10 = (*(code *)**(undefined8 **)&pCVar1->ptr_)(pCVar1);
    iVar9 = (**(this->super_CVmObjTads).super_CVmObject._vptr_CVmObject)(this);
    pvVar8 = sp_;
    if (lVar10 == CONCAT44(extraout_var,iVar9)) {
      uVar4 = *(undefined4 *)&retval->field_0x4;
      vVar5 = (retval->val).obj;
      uVar6 = *(undefined4 *)((long)&retval->val + 4);
      pvVar7 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar7 = retval->typ;
      *(undefined4 *)&pvVar8->field_0x4 = uVar4;
      (pvVar8->val).obj = vVar5;
      *(undefined4 *)((long)&pvVar8->val + 4) = uVar6;
      (**(code **)(*(long *)&pCVar1->ptr_ + 0x80))(pCVar1,uVar2,local_40);
      uVar2 = (retval->val).obj;
      (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 0x110))
                (G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff),retval,uVar2,local_40);
      sp_ = sp_ + -1;
    }
  }
  sp_ = sp_ + -1;
  return;
}

Assistant:

void CVmObjIntClsMod::build_prop_list(VMG_ vm_obj_id_t self, vm_val_t *retval)
{
    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* build our own list */
    CVmObjTads::build_prop_list(vmg_ self, retval);

    /* if we have a base class that we further modify, add its list */
    if (get_sc_count() != 0)
    {
        vm_obj_id_t base_id;
        CVmObject *base_obj;

        /* get the base class */
        base_id = get_sc(0);
        base_obj = vm_objp(vmg_ base_id);

        /* get its list only if it's of our same metaclass */
        if (base_obj->get_metaclass_reg() == get_metaclass_reg())
        {
            vm_val_t base_val;

            /* save our list for gc protection */
            G_stk->push(retval);

            /* get our base class's list */
            base_obj->build_prop_list(vmg_ base_id, &base_val);

            /* add this list to our result list */
            vm_objp(vmg_ retval->val.obj)->
                add_val(vmg_ retval, retval->val.obj, &base_val);

            /* discard our gc protection */
            G_stk->discard();
        }
    }

    /* discard gc protection */
    G_stk->discard();
}